

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
::UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
           *this,GeneratorState *state,char *function,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  pointer pSVar4;
  pointer pSVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_60;
  allocator<char> local_59;
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::SinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::SinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::SinOp>_>
  *local_58;
  VariableType *local_50;
  ExecValueStorage *local_48;
  Scalar *local_40;
  Scalar *local_38;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__UnaryBuiltinVecFunc_0217fb20;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_function,function,&local_59)
  ;
  local_50 = &(this->m_inValueRange).m_type;
  ValueRange::ValueRange((ValueRange *)local_50,valueRange.m_type);
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_child = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = &this->m_value;
  iVar3 = VariableType::getScalarSize(valueRange.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->m_value).m_value,(long)(iVar3 << 6));
  if (0 < (this->m_inValueRange).m_type.m_numElements) {
    local_38 = valueRange.m_min;
    local_40 = valueRange.m_max;
    lVar6 = 0;
    local_58 = this;
    do {
      VariableType::getElementType(valueRange.m_type);
      pSVar5 = (this->m_inValueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->m_inValueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar4 = (this->m_inValueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (this->m_inValueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      VariableType::getElementType(local_50);
      this = local_58;
      if (pSVar4 == pSVar2) {
        pSVar4 = (pointer)0x0;
      }
      if (pSVar5 == pSVar1) {
        pSVar5 = (pointer)0x0;
      }
      fVar7 = local_38[lVar6].floatVal;
      if ((1.0 < fVar7) || (fVar8 = local_40[lVar6].floatVal, fVar8 < -1.0)) {
        local_60 = pSVar4[lVar6].floatVal;
      }
      else {
        fVar9 = -1.5707964;
        if (-1.0 <= fVar7) {
          fVar9 = asinf(fVar7);
        }
        pSVar5[lVar6].intVal = (int)fVar9;
        local_60 = 1.5707964;
        if (fVar8 <= 1.0) {
          local_60 = asinf(fVar8);
        }
        pSVar4[lVar6].floatVal = local_60;
      }
      fVar7 = ceilf(pSVar5[lVar6].floatVal * 8.0);
      fVar7 = fVar7 * 0.125;
      if (fVar7 <= local_60) {
        pSVar5[lVar6].floatVal = fVar7;
        fVar8 = floorf(pSVar4[lVar6].floatVal * 8.0);
        if (fVar7 <= fVar8 * 0.125) {
          pSVar4[lVar6].floatVal = fVar8 * 0.125;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->m_inValueRange).m_type.m_numElements);
  }
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::UnaryBuiltinVecFunc (GeneratorState& state, const char* function, ConstValueRangeAccess valueRange)
	: m_function		(function)
	, m_inValueRange	(valueRange.getType())
	, m_child			(DE_NULL)
{
	DE_UNREF(state);
	DE_ASSERT(valueRange.getType().isFloatOrVec());

	m_value.setStorage(valueRange.getType());

	// Compute input value range
	for (int ndx = 0; ndx < m_inValueRange.getType().getNumElements(); ndx++)
	{
		ConstValueRangeAccess	outRange	= valueRange.component(ndx);
		ValueRangeAccess		inRange		= m_inValueRange.asAccess().component(ndx);

		ComputeValueRange()(outRange.getMin().asFloat(), outRange.getMax().asFloat(), inRange.getMin().asFloat(), inRange.getMax().asFloat());
	}
}